

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

bool __thiscall
QHttpSocketEngine::setMulticastInterface(QHttpSocketEngine *this,QNetworkInterface *param_2)

{
  QLatin1StringView latin1;
  qsizetype in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar1;
  char *file;
  SocketError error;
  QMessageLogger *pQVar2;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  file = local_28;
  pQVar2 = in_RDI;
  QMessageLogger::QMessageLogger(in_RDI,file,0,in_stack_ffffffffffffff78);
  QMessageLogger::warning(file,"Operation is not supported");
  Qt::Literals::StringLiterals::operator____L1(file,CONCAT44(uVar1,in_stack_ffffffffffffff80));
  error = (SocketError)((ulong)file >> 0x20);
  latin1.m_data = (char *)pQVar2;
  latin1.m_size = in_RSI;
  QString::QString((QString *)in_RDI,latin1);
  QAbstractSocketEngine::setError
            ((QAbstractSocketEngine *)in_RDI,error,
             (QString *)CONCAT44(uVar1,in_stack_ffffffffffffff80));
  QString::~QString((QString *)0x339f01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::setMulticastInterface(const QNetworkInterface &)
{
    qWarning("Operation is not supported");
    setError(QAbstractSocket::UnsupportedSocketOperationError, "Unsupported socket operation"_L1);
    return false;
}